

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Frame::Frame(Frame *this,FrameKind *kind,LocationRange *location)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  
  this->kind = (FrameKind)kind;
  this->ast = (AST *)0x0;
  (this->location).file._M_dataplus._M_p = (pointer)&(this->location).file.field_2;
  pcVar2 = (location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->location,pcVar2,pcVar2 + (location->file)._M_string_length);
  uVar3 = (location->begin).line;
  uVar4 = (location->begin).column;
  uVar5 = (location->end).column;
  (this->location).end.line = (location->end).line;
  (this->location).end.column = uVar5;
  (this->location).begin.line = uVar3;
  (this->location).begin.column = uVar4;
  this->tailCall = false;
  (this->fit)._M_current = (Field *)0x0;
  p_Var1 = &(this->objectFields)._M_t._M_impl.super__Rb_tree_header;
  (this->objectFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objectFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objectFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objectFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objectFields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->elementId = 0;
  p_Var1 = &(this->elements)._M_t._M_impl.super__Rb_tree_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->thunks).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thunks).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thunks).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = L'\0';
  (this->bytes)._M_dataplus._M_p = (pointer)&(this->bytes).field_2;
  (this->bytes)._M_string_length = 0;
  (this->bytes).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->bindings)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->offset = 0;
  this->context = (HeapEntity *)0x0;
  this->self = (HeapObject *)0x0;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->val).t = NULL_TYPE;
  (this->val2).t = NULL_TYPE;
  return;
}

Assistant:

Frame(const FrameKind &kind, const LocationRange &location)
        : kind(kind),
          ast(nullptr),
          location(location),
          tailCall(false),
          elementId(0),
          context(NULL),
          self(NULL),
          offset(0)
    {
        val.t = Value::NULL_TYPE;
        val2.t = Value::NULL_TYPE;
    }